

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

int xmlParserInputBufferPush(xmlParserInputBufferPtr in,int len,char *buf)

{
  int iVar1;
  xmlBufPtr pxVar2;
  size_t sVar3;
  size_t sVar4;
  uint use;
  int ret;
  int nbchars;
  char *buf_local;
  int len_local;
  xmlParserInputBufferPtr in_local;
  
  if (len < 0) {
    in_local._4_4_ = 0;
  }
  else if ((in == (xmlParserInputBufferPtr)0x0) || (in->error != 0)) {
    in_local._4_4_ = 0xffffffff;
  }
  else {
    if (in->encoder == (xmlCharEncodingHandlerPtr)0x0) {
      iVar1 = xmlBufAdd(in->buffer,(xmlChar *)buf,len);
      use = len;
      if (iVar1 != 0) {
        return -1;
      }
    }
    else {
      if (in->raw == (xmlBufPtr)0x0) {
        pxVar2 = xmlBufCreate();
        in->raw = pxVar2;
      }
      iVar1 = xmlBufAdd(in->raw,(xmlChar *)buf,len);
      if (iVar1 != 0) {
        return -1;
      }
      sVar3 = xmlBufUse(in->raw);
      use = xmlCharEncInput(in,1);
      if ((int)use < 0) {
        xmlIOErr(0x608,(char *)0x0);
        in->error = 0x608;
        return -1;
      }
      sVar4 = xmlBufUse(in->raw);
      in->rawconsumed = ((sVar3 & 0xffffffff) - sVar4) + in->rawconsumed;
    }
    in_local._4_4_ = use;
  }
  return in_local._4_4_;
}

Assistant:

int
xmlParserInputBufferPush(xmlParserInputBufferPtr in,
	                 int len, const char *buf) {
    int nbchars = 0;
    int ret;

    if (len < 0) return(0);
    if ((in == NULL) || (in->error)) return(-1);
    if (in->encoder != NULL) {
        unsigned int use;

        /*
	 * Store the data in the incoming raw buffer
	 */
        if (in->raw == NULL) {
	    in->raw = xmlBufCreate();
	}
	ret = xmlBufAdd(in->raw, (const xmlChar *) buf, len);
	if (ret != 0)
	    return(-1);

	/*
	 * convert as much as possible to the parser reading buffer.
	 */
	use = xmlBufUse(in->raw);
	nbchars = xmlCharEncInput(in, 1);
	if (nbchars < 0) {
	    xmlIOErr(XML_IO_ENCODER, NULL);
	    in->error = XML_IO_ENCODER;
	    return(-1);
	}
	in->rawconsumed += (use - xmlBufUse(in->raw));
    } else {
	nbchars = len;
        ret = xmlBufAdd(in->buffer, (xmlChar *) buf, nbchars);
	if (ret != 0)
	    return(-1);
    }
#ifdef DEBUG_INPUT
    xmlGenericError(xmlGenericErrorContext,
	    "I/O: pushed %d chars, buffer %d/%d\n",
            nbchars, xmlBufUse(in->buffer), xmlBufLength(in->buffer));
#endif
    return(nbchars);
}